

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.h
# Opt level: O0

_Bool sha256_block_write(sha256_block *blk,void **vdata,size_t *len)

{
  void *__src;
  bool bVar1;
  size_t local_48;
  uint8_t *p;
  size_t chunk;
  size_t blkleft;
  size_t *len_local;
  void **vdata_local;
  sha256_block *blk_local;
  
  local_48 = 0x40 - blk->used;
  if (*len < local_48) {
    local_48 = *len;
  }
  __src = *vdata;
  memcpy(blk->block + blk->used,__src,local_48);
  *vdata = (void *)((long)__src + local_48);
  *len = *len - local_48;
  blk->used = local_48 + blk->used;
  blk->len = local_48 + blk->len;
  bVar1 = blk->used == 0x40;
  if (bVar1) {
    blk->used = 0;
  }
  return bVar1;
}

Assistant:

static inline bool sha256_block_write(
    sha256_block *blk, const void **vdata, size_t *len)
{
    size_t blkleft = sizeof(blk->block) - blk->used;
    size_t chunk = *len < blkleft ? *len : blkleft;

    const uint8_t *p = *vdata;
    memcpy(blk->block + blk->used, p, chunk);
    *vdata = p + chunk;
    *len -= chunk;
    blk->used += chunk;
    blk->len += chunk;

    if (blk->used == sizeof(blk->block)) {
        blk->used = 0;
        return true;
    }

    return false;
}